

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrtf.cpp
# Opt level: O3

vector<std::string> *
EnumerateHrtf_abi_cxx11_(vector<std::string> *__return_storage_ptr__,char *devname)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 uVar3;
  undefined8 __n;
  uint uVar4;
  bool bVar5;
  int iVar6;
  pointer pHVar7;
  size_t sVar8;
  long *plVar9;
  ulong uVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  _Var11;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  pointer pHVar13;
  string *psVar14;
  pointer pHVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  _Alloc_hider _Var17;
  long lVar18;
  HrtfEntry *pHVar19;
  vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>> *this;
  uint uVar20;
  uint __uval;
  uint __val;
  string __str_1;
  string pname;
  string newname;
  string __str;
  undefined1 local_108 [24];
  undefined1 local_f0 [8];
  undefined8 *puStack_e8;
  undefined8 local_d8 [2];
  undefined1 local_c8 [24];
  undefined1 auStack_b0 [16];
  undefined1 local_a0 [32];
  vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>> *local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = devname;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::EnumeratedHrtfLock);
  pbVar16 = DAT_0022cf10;
  pbVar2 = (anonymous_namespace)::EnumeratedHrtfs;
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pbVar12 = (anonymous_namespace)::EnumeratedHrtfs;
  if (DAT_0022cf10 != (anonymous_namespace)::EnumeratedHrtfs) {
    do {
      std::allocator_traits<al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>::
      destroy<(anonymous_namespace)::HrtfEntry>
                ((allocator<(anonymous_namespace)::HrtfEntry,_8UL> *)pbVar12,(HrtfEntry *)devname);
      pbVar12 = pbVar12 + 2;
    } while (pbVar12 != pbVar16);
    DAT_0022cf10 = pbVar2;
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,local_58,(char *)0x0,"hrtf-paths");
  local_f0 = (undefined1  [8])0x0;
  puStack_e8 = (undefined8 *)0x0;
  local_80 = (vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>> *)
             __return_storage_ptr__;
  if (local_c8[0] == (string)0x1) {
    _Var17._M_p = (pointer)local_c8._8_8_;
    if ((undefined1 *)local_c8._8_8_ == auStack_b0) {
      puStack_e8 = (undefined8 *)CONCAT44(auStack_b0._12_4_,auStack_b0._8_4_);
      _Var17._M_p = (pointer)local_f0;
    }
    local_f0._4_4_ = auStack_b0._4_4_;
    local_f0._0_4_ = auStack_b0._0_4_;
    local_108._16_8_ = local_c8._16_8_;
    local_108[0] = (string)0x1;
    bVar5 = true;
    local_108._8_8_ = _Var17._M_p;
    if ((pointer)_Var17._M_p == (pointer)0x0) {
LAB_00152236:
      this = local_80;
      if ((pointer)local_108._8_8_ != (pointer)local_f0) {
        operator_delete((void *)local_108._8_8_,(ulong)((long)local_f0 + 1));
      }
    }
    else {
      do {
        cVar1 = *(char *)&(((pointer)_Var17._M_p)->mDispName)._M_dataplus._M_p;
        if (cVar1 == '\0') break;
        iVar6 = isspace((int)cVar1);
        if ((cVar1 == ',') || (iVar6 != 0)) {
          do {
            do {
              cVar1 = *(char *)((long)&(((pointer)_Var17._M_p)->mDispName)._M_dataplus._M_p + 1);
              _Var17._M_p = (pointer)((long)&(((pointer)_Var17._M_p)->mDispName)._M_dataplus._M_p +
                                     1);
              iVar6 = isspace((int)cVar1);
            } while (cVar1 == 0x2c);
          } while (iVar6 != 0);
          pHVar15 = (pointer)_Var17._M_p;
          if (cVar1 != '\0') goto LAB_00152169;
        }
        else {
LAB_00152169:
          pHVar7 = (pointer)strchr(_Var17._M_p,0x2c);
          if (pHVar7 == (pointer)0x0) {
            sVar8 = strlen(_Var17._M_p);
            pHVar15 = (pointer)0x0;
            bVar5 = false;
            pHVar7 = (pointer)((long)&(((pointer)_Var17._M_p)->mDispName)._M_dataplus._M_p + sVar8);
          }
          else {
            pHVar15 = (pointer)((long)&(pHVar7->mDispName)._M_dataplus._M_p + 1);
          }
          do {
            pHVar13 = pHVar7;
            if (pHVar13 == (pointer)_Var17._M_p) goto LAB_0015221c;
            iVar6 = isspace((int)pHVar13[-1].mFilename.field_2._M_local_buf[0xf]);
            pHVar7 = (pointer)((long)&pHVar13[-1].mFilename.field_2 + 0xf);
          } while (iVar6 != 0);
          local_c8._0_8_ = (HrtfEntry *)(local_c8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,_Var17._M_p,pHVar13);
          SearchDataFiles_abi_cxx11_((vector<std::string> *)local_a0,".mhr",(char *)local_c8._0_8_);
          uVar3 = local_a0._8_8_;
          for (psVar14 = (string *)local_a0._0_8_; psVar14 != (string *)uVar3; psVar14 = psVar14 + 1
              ) {
            anon_unknown.dwarf_1c14fa::AddFileEntry(psVar14);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ::~vector((vector<std::string> *)local_a0);
          if ((HrtfEntry *)local_c8._0_8_ != (HrtfEntry *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
          }
        }
LAB_0015221c:
        _Var17._M_p = (pointer)pHVar15;
      } while ((pointer)_Var17._M_p != (pointer)0x0);
      this = local_80;
      if ((local_108._0_8_ & 1) != 0) goto LAB_00152236;
    }
    if (!bVar5) goto LAB_0015282f;
  }
  SearchDataFiles_abi_cxx11_((vector<std::string> *)local_108,".mhr","openal/hrtf");
  uVar3 = local_108._8_8_;
  for (pHVar15 = (pointer)local_108._0_8_; pHVar15 != (pointer)uVar3;
      pHVar15 = (pointer)&pHVar15->mFilename) {
    anon_unknown.dwarf_1c14fa::AddFileEntry(&pHVar15->mDispName);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             *)local_108);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Built-In HRTF","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  *(undefined1 *)local_50[0] = 0x31;
  plVar9 = (long *)std::__cxx11::string::insert((ulong)local_50,0,'\x01');
  local_a0._0_8_ = local_a0 + 0x10;
  psVar14 = (string *)(plVar9 + 2);
  if ((string *)*plVar9 == psVar14) {
    local_a0._16_8_ = (psVar14->_M_dataplus)._M_p;
    local_a0._24_8_ = plVar9[3];
  }
  else {
    local_a0._16_8_ = (psVar14->_M_dataplus)._M_p;
    local_a0._0_8_ = (string *)*plVar9;
  }
  local_a0._8_8_ = plVar9[1];
  *plVar9 = (long)psVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_a0,local_a0._8_8_,0,'\x01');
  pHVar15 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pHVar15) {
    local_108._16_8_ = (pHVar15->mDispName)._M_dataplus._M_p;
    local_f0 = (undefined1  [8])plVar9[3];
    local_108._0_8_ = (pointer)(local_108 + 0x10);
  }
  else {
    local_108._16_8_ = (pHVar15->mDispName)._M_dataplus._M_p;
    local_108._0_8_ = (pointer)*plVar9;
  }
  local_108._8_8_ = plVar9[1];
  *plVar9 = (long)pHVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append(local_108,(ulong)local_78);
  local_c8._0_8_ = local_c8 + 0x10;
  pHVar19 = (HrtfEntry *)(plVar9 + 2);
  if ((HrtfEntry *)*plVar9 == pHVar19) {
    local_c8._16_8_ = (pHVar19->mDispName)._M_dataplus._M_p;
    auStack_b0._0_4_ = (undefined4)plVar9[3];
    auStack_b0._4_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
  }
  else {
    local_c8._16_8_ = (pHVar19->mDispName)._M_dataplus._M_p;
    local_c8._0_8_ = (HrtfEntry *)*plVar9;
  }
  local_c8._8_8_ = plVar9[1];
  *plVar9 = (long)pHVar19;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,
                    (ulong)((long)&(((string *)local_108._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((string *)local_a0._0_8_ != (string *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  __n = local_c8._8_8_;
  uVar3 = local_c8._0_8_;
  pbVar2 = DAT_0022cf10;
  uVar10 = (long)DAT_0022cf10 - (long)(anonymous_namespace)::EnumeratedHrtfs;
  pbVar16 = (anonymous_namespace)::EnumeratedHrtfs;
  if (0 < (long)uVar10 >> 8) {
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&((anonymous_namespace)::EnumeratedHrtfs->_M_dataplus)._M_p +
              (uVar10 & 0xffffffffffffff00));
    lVar18 = ((long)uVar10 >> 8) + 1;
    pbVar16 = (anonymous_namespace)::EnumeratedHrtfs + 4;
    do {
      if ((pointer)__n == (pointer)pbVar16[-3]._M_string_length) {
        if (((pointer)__n == (pointer)0x0) ||
           (iVar6 = bcmp(pbVar16[-3]._M_dataplus._M_p,(void *)uVar3,__n), iVar6 == 0)) {
          pbVar16 = pbVar16 + -4;
          goto LAB_00152601;
        }
        if ((pointer)__n == (pointer)pbVar16[-1]._M_string_length) goto LAB_001524c4;
      }
      else if ((pointer)__n == (pointer)pbVar16[-1]._M_string_length) {
        if ((pointer)__n != (pointer)0x0) {
LAB_001524c4:
          iVar6 = bcmp(pbVar16[-1]._M_dataplus._M_p,(void *)uVar3,__n);
          if (iVar6 != 0) goto LAB_001524db;
        }
        pbVar16 = pbVar16 + -2;
        goto LAB_00152601;
      }
LAB_001524db:
      if ((pointer)__n == (pointer)pbVar16[1]._M_string_length) {
        if (((pointer)__n == (pointer)0x0) ||
           (iVar6 = bcmp(pbVar16[1]._M_dataplus._M_p,(void *)uVar3,__n), iVar6 == 0))
        goto LAB_00152601;
        if ((pointer)__n == (pointer)pbVar16[3]._M_string_length) {
LAB_00152518:
          iVar6 = bcmp(pbVar16[3]._M_dataplus._M_p,(void *)uVar3,__n);
          if (iVar6 == 0) goto LAB_001525fa;
        }
      }
      else if ((pointer)__n == (pointer)pbVar16[3]._M_string_length) {
        if ((pointer)__n != (pointer)0x0) goto LAB_00152518;
LAB_001525fa:
        pbVar16 = pbVar16 + 2;
        goto LAB_00152601;
      }
      lVar18 = lVar18 + -1;
      pbVar16 = pbVar16 + 8;
    } while (1 < lVar18);
    uVar10 = (long)pbVar2 - (long)pbVar12;
    pbVar16 = pbVar12;
  }
  uVar3 = local_c8._8_8_;
  lVar18 = (long)uVar10 >> 6;
  if (lVar18 == 3) {
    _Var17._M_p = (pointer)pbVar16[1]._M_string_length;
    if (((pointer)local_c8._8_8_ != _Var17._M_p) ||
       (((pointer)_Var17._M_p != (pointer)0x0 &&
        (iVar6 = bcmp(pbVar16[1]._M_dataplus._M_p,(void *)local_c8._0_8_,(size_t)_Var17._M_p),
        iVar6 != 0)))) {
      pbVar16 = pbVar16 + 2;
      goto LAB_001525aa;
    }
LAB_00152601:
    this = local_80;
    if (pbVar16 == pbVar2) goto LAB_0015262d;
    if (2 < (int)gLogLevel) {
      EnumerateHrtf_abi_cxx11_();
    }
  }
  else {
    if (lVar18 == 2) {
LAB_001525aa:
      if (((pointer)uVar3 != (pointer)pbVar16[1]._M_string_length) ||
         (((pointer)uVar3 != (pointer)0x0 &&
          (iVar6 = bcmp(pbVar16[1]._M_dataplus._M_p,(void *)local_c8._0_8_,uVar3), iVar6 != 0)))) {
        pbVar16 = pbVar16 + 2;
        goto LAB_001525d0;
      }
      goto LAB_00152601;
    }
    if (lVar18 == 1) {
LAB_001525d0:
      if (((pointer)uVar3 == (pointer)pbVar16[1]._M_string_length) &&
         (((pointer)uVar3 == (pointer)0x0 ||
          (iVar6 = bcmp(pbVar16[1]._M_dataplus._M_p,(void *)local_c8._0_8_,uVar3), iVar6 == 0))))
      goto LAB_00152601;
    }
LAB_0015262d:
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_a0,local_78,local_70 + (long)local_78)
    ;
    bVar5 = anon_unknown.dwarf_1c14fa::checkName((string *)local_a0);
    if (bVar5) {
      uVar20 = 1;
      do {
        std::__cxx11::string::_M_assign((string *)local_a0);
        std::__cxx11::string::append((char *)local_a0);
        __val = uVar20 + 1;
        __len = 1;
        if (8 < uVar20) {
          uVar20 = __val;
          uVar4 = 4;
          do {
            __len = uVar4;
            if (uVar20 < 100) {
              __len = __len - 2;
              goto LAB_001526e3;
            }
            if (uVar20 < 1000) {
              __len = __len - 1;
              goto LAB_001526e3;
            }
            if (uVar20 < 10000) goto LAB_001526e3;
            bVar5 = 99999 < uVar20;
            uVar20 = uVar20 / 10000;
            uVar4 = __len + 4;
          } while (bVar5);
          __len = __len + 1;
        }
LAB_001526e3:
        local_108._0_8_ = local_108 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_108,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108._0_8_,__len,__val);
        std::__cxx11::string::_M_append((char *)local_a0,local_108._0_8_);
        if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,
                          (ulong)((long)&(((string *)local_108._16_8_)->_M_dataplus)._M_p + 1));
        }
        bVar5 = anon_unknown.dwarf_1c14fa::checkName((string *)local_a0);
        uVar20 = __val;
      } while (bVar5);
    }
    local_108._0_8_ = (pointer)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,local_a0._0_8_,
               (pointer)(local_a0._0_8_ + (long)&((_Alloc_hider *)local_a0._8_8_)->_M_p));
    pHVar19 = (HrtfEntry *)local_c8._0_8_;
    puStack_e8 = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f0 + 8),local_c8._0_8_,
               (char *)((long)&(((string *)local_c8._0_8_)->_M_dataplus)._M_p + local_c8._8_8_));
    this = local_80;
    std::
    vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
    ::emplace_back<(anonymous_namespace)::HrtfEntry>
              ((vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
                *)local_108,pHVar19);
    if (puStack_e8 != local_d8) {
      operator_delete(puStack_e8,local_d8[0] + 1);
    }
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,
                      (ulong)((long)&(((string *)local_108._16_8_)->_M_dataplus)._M_p + 1));
    }
    if (2 < (int)gLogLevel) {
      EnumerateHrtf_abi_cxx11_();
    }
    if ((string *)local_a0._0_8_ != (string *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
    }
  }
  if ((HrtfEntry *)local_c8._0_8_ != (HrtfEntry *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
LAB_0015282f:
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             *)this,(long)DAT_0022cf10 - (long)(anonymous_namespace)::EnumeratedHrtfs >> 6);
  pbVar2 = DAT_0022cf10;
  for (pbVar16 = (anonymous_namespace)::EnumeratedHrtfs; pbVar16 != pbVar2; pbVar16 = pbVar16 + 2) {
    std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>::
    emplace_back<std::__cxx11::string&>(this,pbVar16);
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,local_58,(char *)0x0,"default-hrtf");
  uVar3 = local_108._0_8_;
  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  local_f0 = (undefined1  [8])0x0;
  puStack_e8 = (undefined8 *)0x0;
  if (local_c8[0] == (string)0x1) {
    local_108._8_8_ = local_f0;
    if ((undefined1 *)local_c8._8_8_ == auStack_b0) {
      puStack_e8 = (undefined8 *)CONCAT44(auStack_b0._12_4_,auStack_b0._8_4_);
    }
    else {
      local_108._8_8_ = local_c8._8_8_;
    }
    local_f0._4_4_ = auStack_b0._4_4_;
    local_f0._0_4_ = auStack_b0._0_4_;
    local_108._16_8_ = local_c8._16_8_;
    local_108._1_7_ = SUB87(uVar3,1);
    local_108[0] = (string)0x1;
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (*(undefined8 *)this,*(undefined8 *)(this + 8),local_108 + 8);
    if (_Var11._M_current ==
        *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8)) {
      if (1 < (int)gLogLevel) {
        EnumerateHrtf_abi_cxx11_();
      }
    }
    else if (_Var11._M_current !=
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this) {
      std::_V2::
      __rotate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>>
                (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this,
                 _Var11._M_current,_Var11._M_current + 1);
    }
  }
  if ((local_108[0] == (string)0x1) && ((pointer)local_108._8_8_ != (pointer)local_f0)) {
    operator_delete((void *)local_108._8_8_,(ulong)((long)local_f0 + 1));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::EnumeratedHrtfLock);
  return (vector<std::string> *)this;
}

Assistant:

al::vector<std::string> EnumerateHrtf(const char *devname)
{
    std::lock_guard<std::mutex> _{EnumeratedHrtfLock};
    EnumeratedHrtfs.clear();

    bool usedefaults{true};
    if(auto pathopt = ConfigValueStr(devname, nullptr, "hrtf-paths"))
    {
        const char *pathlist{pathopt->c_str()};
        while(pathlist && *pathlist)
        {
            const char *next, *end;

            while(isspace(*pathlist) || *pathlist == ',')
                pathlist++;
            if(*pathlist == '\0')
                continue;

            next = strchr(pathlist, ',');
            if(next)
                end = next++;
            else
            {
                end = pathlist + strlen(pathlist);
                usedefaults = false;
            }

            while(end != pathlist && isspace(*(end-1)))
                --end;
            if(end != pathlist)
            {
                const std::string pname{pathlist, end};
                for(const auto &fname : SearchDataFiles(".mhr", pname.c_str()))
                    AddFileEntry(fname);
            }

            pathlist = next;
        }
    }

    if(usedefaults)
    {
        for(const auto &fname : SearchDataFiles(".mhr", "openal/hrtf"))
            AddFileEntry(fname);

        if(!GetResource(IDR_DEFAULT_HRTF_MHR).empty())
            AddBuiltInEntry("Built-In HRTF", IDR_DEFAULT_HRTF_MHR);
    }

    al::vector<std::string> list;
    list.reserve(EnumeratedHrtfs.size());
    for(auto &entry : EnumeratedHrtfs)
        list.emplace_back(entry.mDispName);

    if(auto defhrtfopt = ConfigValueStr(devname, nullptr, "default-hrtf"))
    {
        auto iter = std::find(list.begin(), list.end(), *defhrtfopt);
        if(iter == list.end())
            WARN("Failed to find default HRTF \"%s\"\n", defhrtfopt->c_str());
        else if(iter != list.begin())
            std::rotate(list.begin(), iter, iter+1);
    }

    return list;
}